

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O2

void __thiscall pm::World::World(World *this)

{
  _Head_base<0UL,_pm::Light_*,_false> local_28;
  undefined4 local_1c;
  
  ViewPlane::ViewPlane(&this->viewplane_);
  (this->background_).r = 0.0;
  (this->background_).g = 0.0;
  (this->background_).b = 0.0;
  (this->objects_).
  super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects_).
  super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects_).
  super__Vector_base<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->materials_).
  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials_).
  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials_).
  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = 0;
  std::make_unique<pm::Ambient,float>((float *)&local_28);
  (this->ambientLight_)._M_t.super___uniq_ptr_impl<pm::Light,_std::default_delete<pm::Light>_>._M_t.
  super__Tuple_impl<0UL,_pm::Light_*,_std::default_delete<pm::Light>_>.
  super__Head_base<0UL,_pm::Light_*,_false>._M_head_impl = local_28._M_head_impl;
  (this->samplers_).
  super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samplers_).
  super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lights_).
  super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->samplers_).
  super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights_).
  super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights_).
  super__Vector_base<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>,_std::allocator<std::unique_ptr<pm::Light,_std::default_delete<pm::Light>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

World::World()
    : background_(0.0f, 0.0f, 0.0f),
      ambientLight_(std::make_unique<Ambient>(0.0f))
{
}